

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void csvStats(ostream *out,list<runData,_std::allocator<runData>_> *data,bool outputSizeData,
             int timing)

{
  bool bVar1;
  ostream *poVar2;
  uint in_ECX;
  byte in_DL;
  undefined8 in_RSI;
  ostream *in_RDI;
  double dVar3;
  string compName;
  runData run;
  iterator __end1;
  iterator __begin1;
  list<runData,_std::allocator<runData>_> *__range1;
  runData *in_stack_fffffffffffffdd8;
  runData *in_stack_fffffffffffffde0;
  ostream *in_stack_fffffffffffffe18;
  ostream *in_stack_fffffffffffffe28;
  string local_178 [32];
  string local_158 [48];
  char *local_128;
  Compression local_11c;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  byte local_68;
  byte local_67;
  ulong local_40;
  ulong local_38;
  _Self local_30;
  _Self local_28;
  undefined8 local_20;
  uint local_18;
  byte local_11;
  undefined8 local_10;
  ostream *local_8;
  
  local_11 = in_DL & 1;
  local_18 = in_ECX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::operator<<(in_RDI,"file name");
  if ((local_11 & 1) != 0) {
    std::operator<<(local_8,",input size,pixel count,channel count,tile count,raw size");
  }
  std::operator<<(local_8,",compression,pixel mode");
  if ((local_11 & 1) != 0) {
    std::operator<<(local_8,",output size");
  }
  if ((local_18 & 1) != 0) {
    std::operator<<(local_8,",count read time");
    std::operator<<(local_8,",read time");
  }
  if ((local_18 & 2) != 0) {
    std::operator<<(local_8,",write time");
  }
  if ((local_18 & 4) != 0) {
    std::operator<<(local_8,",count reread time");
    std::operator<<(local_8,",reread time");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  local_20 = local_10;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<runData,_std::allocator<runData>_>::begin
                 ((list<runData,_std::allocator<runData>_> *)in_stack_fffffffffffffdd8);
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<runData,_std::allocator<runData>_>::end
                 ((list<runData,_std::allocator<runData>_> *)in_stack_fffffffffffffdd8);
  while( true ) {
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    std::_List_iterator<runData>::operator*((_List_iterator<runData> *)0x109926);
    runData::runData(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    std::operator<<(local_8,local_128);
    if ((local_11 & 1) != 0) {
      poVar2 = std::operator<<(local_8,',');
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_40);
      poVar2 = std::operator<<(poVar2,',');
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_80);
      poVar2 = std::operator<<(poVar2,',');
      std::ostream::operator<<(poVar2,local_78);
      if ((local_67 & 1) == 0) {
        std::operator<<(local_8,",---");
      }
      else {
        poVar2 = std::operator<<(local_8,',');
        std::ostream::operator<<(poVar2,local_70);
      }
      poVar2 = std::operator<<(local_8,',');
      std::ostream::operator<<(poVar2,local_88);
    }
    std::__cxx11::string::string(local_158);
    if (local_11c == NUM_COMPRESSION_METHODS) {
      std::__cxx11::string::operator=(local_158,"original");
    }
    else {
      Imf_3_4::getCompressionNameFromId(local_11c,local_158);
    }
    poVar2 = std::operator<<(local_8,',');
    poVar2 = std::operator<<(poVar2,local_158);
    poVar2 = std::operator<<(poVar2,',');
    modeName_abi_cxx11_((PixelMode)((ulong)in_stack_fffffffffffffe28 >> 0x20));
    std::operator<<(poVar2,local_178);
    std::__cxx11::string::~string(local_178);
    if ((local_11 & 1) != 0) {
      poVar2 = std::operator<<(local_8,',');
      std::ostream::operator<<(poVar2,local_38);
    }
    if ((local_18 & 1) != 0) {
      if ((local_68 & 1) == 0) {
        std::operator<<(local_8,",---");
      }
      else {
        in_stack_fffffffffffffe28 = std::operator<<(local_8,',');
        dVar3 = median((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe18);
        std::ostream::operator<<(in_stack_fffffffffffffe28,dVar3);
      }
      in_stack_fffffffffffffe18 = std::operator<<(local_8,',');
      dVar3 = median((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe18);
      std::ostream::operator<<(in_stack_fffffffffffffe18,dVar3);
    }
    if ((local_18 & 2) != 0) {
      poVar2 = std::operator<<(local_8,',');
      dVar3 = median((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe18);
      std::ostream::operator<<(poVar2,dVar3);
    }
    if ((local_18 & 4) != 0) {
      if ((local_68 & 1) == 0) {
        std::operator<<(local_8,",---");
      }
      else {
        poVar2 = std::operator<<(local_8,',');
        dVar3 = median((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe18);
        std::ostream::operator<<(poVar2,dVar3);
      }
      poVar2 = std::operator<<(local_8,',');
      in_stack_fffffffffffffde0 =
           (runData *)median((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe18);
      std::ostream::operator<<(poVar2,(double)in_stack_fffffffffffffde0);
    }
    std::operator<<(local_8,"\n");
    std::__cxx11::string::~string(local_158);
    runData::~runData((runData *)0x109dd4);
    std::_List_iterator<runData>::operator++(&local_28);
  }
  return;
}

Assistant:

void
csvStats (ostream& out, list<runData>& data, bool outputSizeData, int timing)
{
    out << "file name";
    if (outputSizeData)
    {
        out << ",input size,pixel count,channel count,tile count,raw size";
    }
    out << ",compression,pixel mode";
    if (outputSizeData) { out << ",output size"; }
    if (timing & options::TIME_READ)
    {
        out << ",count read time";
        out << ",read time";
    }
    if (timing & options::TIME_WRITE) { out << ",write time"; }
    if (timing & options::TIME_REREAD)
    {
        out << ",count reread time";
        out << ",reread time";
    }
    cout << "\n";
    for (runData run: data)
    {
        out << run.file;
        if (outputSizeData)
        {
            out << ',' << run.metrics.inputFileSize << ','
                << run.metrics.totalStats.sizeData.pixelCount << ','
                << run.metrics.totalStats.sizeData.channelCount;
            if (run.metrics.totalStats.sizeData.isTiled)
            {
                out << ',' << run.metrics.totalStats.sizeData.tileCount;
            }
            else { out << ",---"; }
            out << ',' << run.metrics.totalStats.sizeData.rawSize;
        }
        string compName;
        if (run.compression == NUM_COMPRESSION_METHODS)
        {
            compName = "original";
        }
        else { getCompressionNameFromId (run.compression, compName); }
        out << ',' << compName << ',' << modeName (run.mode);

        if (outputSizeData) { out << ',' << run.metrics.outputFileSize; }
        if (timing & options::TIME_READ)
        {
            if (run.metrics.totalStats.sizeData.isDeep)
            {
                out << ',' << median (run.metrics.totalStats.countReadPerf);
            }
            else { out << ",---"; }
            out << ',' << median (run.metrics.totalStats.readPerf);
        }
        if (timing & options::TIME_WRITE)
        {
            out << ',' << median (run.metrics.totalStats.writePerf);
        }
        if (timing & options::TIME_REREAD)
        {
            if (run.metrics.totalStats.sizeData.isDeep)
            {
                out << ',' << median (run.metrics.totalStats.countRereadPerf);
            }
            else { out << ",---"; }
            out << ',' << median (run.metrics.totalStats.rereadPerf);
        }
        out << "\n";
    }
}